

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  ITracker *this_local;
  
  this->_vptr_ITracker = (_func_int **)&PTR__ITracker_0025f110;
  NameAndLocation::~NameAndLocation(&this->m_nameAndLocation);
  return;
}

Assistant:

ITracker::~ITracker() = default;